

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

int sdsll2str(char *s,longlong value)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  size_t local_40;
  size_t l;
  unsigned_long_long v;
  char *pcStack_20;
  char aux;
  char *p;
  longlong value_local;
  char *s_local;
  
  local_40 = value;
  if (value < 0) {
    local_40 = -value;
  }
  l = local_40;
  pcVar4 = s;
  do {
    pcStack_20 = pcVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = l;
    pcVar4 = pcStack_20 + 1;
    *pcStack_20 = SUB161(auVar2 % ZEXT816(10),0) + '0';
    l = l / 10;
  } while (l != 0);
  if (value < 0) {
    *pcVar4 = '-';
    pcVar4 = pcStack_20 + 2;
  }
  pcStack_20 = pcVar4;
  iVar3 = (int)pcStack_20;
  *pcStack_20 = '\0';
  for (value_local = (longlong)s; pcStack_20 = pcStack_20 + -1, (ulong)value_local < pcStack_20;
      value_local = value_local + 1) {
    cVar1 = *(char *)value_local;
    *(char *)value_local = *pcStack_20;
    *pcStack_20 = cVar1;
  }
  return iVar3 - (int)s;
}

Assistant:

int sdsll2str(char *s, long long value) {
    char *p, aux;
    unsigned long long v;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    v = (value < 0) ? -value : value;
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);
    if (value < 0) *p++ = '-';

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}